

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::~Branch(Branch *this)

{
  PromiseArenaMember *node;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_00644bf8;
  node = &((this->dependency).ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->dependency).ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::~Branch() noexcept(false) {}